

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O0

void __thiscall NaPolynomialFunc::Function(NaPolynomialFunc *this,NaReal *x,NaReal *y)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  int i;
  NaReal xi_1;
  NaReal xi;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  double local_28;
  
  iVar1 = NaDynAr<double>::count((NaDynAr<double> *)(in_RDI + 0x20));
  if (iVar1 == 0) {
    *in_RDX = *in_RSI;
  }
  else {
    pdVar3 = NaDynAr<double>::operator[]
                       ((NaDynAr<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    *in_RDX = *pdVar3;
    local_28 = 1.0;
    local_2c = 1;
    while (iVar1 = local_2c, iVar2 = NaDynAr<double>::count((NaDynAr<double> *)(in_RDI + 0x20)),
          iVar1 < iVar2) {
      local_28 = *in_RSI * local_28;
      pdVar3 = NaDynAr<double>::operator[]
                         ((NaDynAr<double> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
      *in_RDX = *pdVar3 * local_28 + *in_RDX;
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

void
NaPolynomialFunc::Function (NaReal* x, NaReal* y)
{
    NaReal	xi = 1;
    if(vfK.count() == 0)
	*y = *x;
    else {
	*y = vfK[0];
	NaReal xi = 1;
	for(int i = 1; i < vfK.count(); ++i) {
	    xi *= *x;
	    *y += vfK[i] * xi;
	}
    }
}